

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Acceptor.cpp
# Opt level: O0

void __thiscall FIX::Acceptor::~Acceptor(Acceptor *this)

{
  code *pcVar1;
  Acceptor *this_local;
  
  pcVar1 = (code *)invalidInstructionException();
  (*pcVar1)();
}

Assistant:

Acceptor::~Acceptor()
{
  Sessions::iterator i;
  for ( i = m_sessions.begin(); i != m_sessions.end(); ++i )
    delete i->second;

  if( m_pLogFactory && m_pLog )
    m_pLogFactory->destroy( m_pLog );
}